

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_not_mtsafe_st_env_infrastructure.cpp
# Opt level: O3

void __thiscall
so_5::env_infrastructures::simple_not_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::
try_handle_next_demand
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
           *this)

{
  atomic_refcounted_t *paVar1;
  activity_stats_t *paVar2;
  timer_manager_t *ptVar3;
  pop_result_t pVar4;
  int iVar5;
  rep rVar6;
  ulong uVar7;
  int *piVar8;
  execution_demand_t demand;
  execution_demand_t local_58;
  timespec local_20;
  int extraout_var;
  
  local_58.m_mbox_id = 0;
  local_58.m_receiver = (agent_t *)0x0;
  local_58.m_limit = (control_block_t *)0x0;
  local_58.m_msg_type._M_target = (type_info *)&void::typeinfo;
  local_58.m_message_ref.m_obj = (message_t *)0x0;
  local_58.m_demand_handler = (demand_handler_pfn_t)0x0;
  pVar4 = event_queue_impl_t::pop(&this->m_event_queue,&local_58);
  if (pVar4 == empty_queue) {
    iVar5 = (*((this->m_timer_manager)._M_t.
               super___uniq_ptr_impl<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>
               ._M_t.
               super__Tuple_impl<0UL,_so_5::timer_manager_t_*,_std::default_delete<so_5::timer_manager_t>_>
               .super__Head_base<0UL,_so_5::timer_manager_t_*,_false>._M_head_impl)->
              _vptr_timer_manager_t[6])();
    if ((char)iVar5 == '\0') {
      if ((this->m_activity_tracker).m_waiting.m_is_in_working == false) {
        (this->m_activity_tracker).m_waiting.m_is_in_working = true;
        rVar6 = std::chrono::_V2::steady_clock::now();
        (this->m_activity_tracker).m_waiting.m_work_started_at.__d.__r = rVar6;
        paVar2 = &(this->m_activity_tracker).m_waiting.m_work_activity;
        paVar2->m_count = paVar2->m_count + 1;
      }
      ptVar3 = (this->m_timer_manager)._M_t.
               super___uniq_ptr_impl<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>
               ._M_t.
               super__Tuple_impl<0UL,_so_5::timer_manager_t_*,_std::default_delete<so_5::timer_manager_t>_>
               .super__Head_base<0UL,_so_5::timer_manager_t_*,_false>._M_head_impl;
      iVar5 = (*ptVar3->_vptr_timer_manager_t[3])(ptVar3,86400000000000);
      uVar7 = CONCAT44(extraout_var,iVar5);
      if (uVar7 != 0 && -1 < extraout_var) {
        local_20.tv_sec = uVar7 / 1000000000;
        local_20.tv_nsec = uVar7 % 1000000000;
        do {
          iVar5 = nanosleep(&local_20,&local_20);
          if (iVar5 != -1) break;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
      }
    }
    else {
      (*(this->super_environment_infrastructure_t)._vptr_environment_infrastructure_t[3])(this);
    }
  }
  else {
    stats::activity_tracking_stuff::
    stats_collector_t<so_5::stats::activity_tracking_stuff::null_lock>::stop
              (&(this->m_activity_tracker).m_waiting);
    (this->m_activity_tracker).m_working.m_is_in_working = true;
    rVar6 = std::chrono::_V2::steady_clock::now();
    (this->m_activity_tracker).m_working.m_work_started_at.__d.__r = rVar6;
    paVar2 = &(this->m_activity_tracker).m_working.m_work_activity;
    paVar2->m_count = paVar2->m_count + 1;
    (*local_58.m_demand_handler)
              ((current_thread_id_t)
               (this->m_default_disp).
               super_default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
               .m_thread_id._M_thread,&local_58);
    stats::activity_tracking_stuff::
    stats_collector_t<so_5::stats::activity_tracking_stuff::null_lock>::stop
              (&(this->m_activity_tracker).m_working);
  }
  if (local_58.m_message_ref.m_obj != (message_t *)0x0) {
    LOCK();
    paVar1 = &(local_58.m_message_ref.m_obj)->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       (local_58.m_message_ref.m_obj != (message_t *)0x0)) {
      (*(local_58.m_message_ref.m_obj)->_vptr_message_t[1])();
    }
  }
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::try_handle_next_demand()
	{
		execution_demand_t demand;
		const auto pop_result = m_event_queue.pop( demand );
		// If there is no demands we must go to sleep for some time...
		if( event_queue_impl_t::pop_result_t::empty_queue == pop_result )
			{
				// We must try to sleep for next timer but only if
				// there is any timer.
				if( !m_timer_manager->empty() )
					{
						// Tracking time for 'waiting' state must be turned on.
						m_activity_tracker.wait_start_if_not_started();

						const auto sleep_time =
								m_timer_manager->timeout_before_nearest_timer(
										// We can use very large value here.
										std::chrono::hours(24) );

						std::this_thread::sleep_for( sleep_time );
					}
				else
					// There are no demands and there are no timers.
					// Environment's work must be finished.
					stop();
			}
		else
			{
				// Tracking time for 'waiting' must be turned off, but
				// tracking time for 'working' must be tuned on and then off again.
				m_activity_tracker.wait_stopped();
				m_activity_tracker.work_started();
				auto work_tracking_stopper = so_5::details::at_scope_exit(
						[this]{ m_activity_tracker.work_stopped(); } );

				// There is at least one demand to process.
				m_default_disp.handle_demand( demand );
			}
	}